

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeCreator.hpp
# Opt level: O3

void __thiscall
OpenMD::LatticeBuilder<OpenMD::BCCLattice>::~LatticeBuilder
          (LatticeBuilder<OpenMD::BCCLattice> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_LatticeCreator)._vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_00306118;
  pcVar2 = (this->super_LatticeCreator).ident_._M_dataplus._M_p;
  paVar1 = &(this->super_LatticeCreator).ident_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

LatticeBuilder(const std::string& ident) : LatticeCreator(ident) {}